

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<capnp::ClientHook_&> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::getResolved
          (DeferredThirdPartyClient *this)

{
  long in_RSI;
  
  if (*(int *)(in_RSI + 0x40) == 2) {
    (**(code **)(**(long **)(in_RSI + 0x50) + 0x10))(this);
  }
  else {
    if (*(int *)(in_RSI + 0x40) != 1) {
      kj::_::unreachable();
    }
    (this->super_RpcClient).super_ClientHook._vptr_ClientHook = (_func_int **)0x0;
  }
  return (Maybe<capnp::ClientHook_&>)(ClientHook *)this;
}

Assistant:

kj::Maybe<ClientHook&> getResolved() override {
      // This is tricky: Although whenMoreResolved() triggers accept, getResolved() shouldn't,
      // because lots of stuff calls getResolved() optimistically and it doesn't necessarily mean
      // the caller wants to use the capability.
      KJ_SWITCH_ONEOF(state) {
        KJ_CASE_ONEOF(deferred, Deferred) {
          return kj::none;
        }
        KJ_CASE_ONEOF(cap, kj::Own<ClientHook>) {
          return cap->getResolved();
        }
      }
      KJ_UNREACHABLE;
    }